

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_Jinx::Variant_&,_const_double_&> * __thiscall
Catch::ExprLhs<Jinx::Variant_const&>::operator==
          (BinaryExpr<const_Jinx::Variant_&,_const_double_&> *__return_storage_ptr__,
          ExprLhs<Jinx::Variant_const&> *this,double *rhs)

{
  Variant *lhs;
  bool comparisonResult;
  StringRef local_30;
  double *local_20;
  double *rhs_local;
  ExprLhs<const_Jinx::Variant_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (double *)this;
  this_local = (ExprLhs<const_Jinx::Variant_&> *)__return_storage_ptr__;
  comparisonResult = compareEqual<Jinx::Variant,double>(*(Variant **)this,rhs);
  lhs = *(Variant **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_Jinx::Variant_&,_const_double_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }